

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

SubtractBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_subtractbroadcastable(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x389) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x389;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    SubtractBroadcastableLayerParams::SubtractBroadcastableLayerParams
              (this_00.subtractbroadcastable_);
    (this->layer_).subtractbroadcastable_ = (SubtractBroadcastableLayerParams *)this_00;
  }
  return (SubtractBroadcastableLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::SubtractBroadcastableLayerParams* NeuralNetworkLayer::mutable_subtractbroadcastable() {
  if (!has_subtractbroadcastable()) {
    clear_layer();
    set_has_subtractbroadcastable();
    layer_.subtractbroadcastable_ = new ::CoreML::Specification::SubtractBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.subtractBroadcastable)
  return layer_.subtractbroadcastable_;
}